

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_mul_v_s128_128_640(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [64];
  uint w;
  int iVar2;
  uint i;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  word128 cval [5];
  
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  cval[4][0] = auVar1._48_8_;
  cval[4][1] = auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  cval[0][0] = auVar1._0_8_;
  cval[0][1] = auVar1._8_8_;
  cval[1][0] = auVar1._16_8_;
  cval[1][1] = auVar1._24_8_;
  cval[2][0] = auVar1._32_8_;
  cval[2][1] = auVar1._40_8_;
  cval[3][0] = auVar1._48_8_;
  cval[3][1] = auVar1._56_8_;
  iVar2 = 2;
  do {
    iVar3 = 0x40;
    do {
      auVar5 = vpbroadcastq_avx512vl();
      lVar4 = 0;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar4),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x20);
      lVar4 = 0x20;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar4),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x40);
      auVar6._8_8_ = cval[4][1];
      auVar6._0_8_ = cval[4][0];
      auVar5 = vpternlogq_avx512vl(auVar5,*(undefined1 (*) [16])A[2].w64,auVar6,0x6a);
      cval[4][0] = auVar5._0_8_;
      cval[4][1] = auVar5._8_8_;
      A = A + 3;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  c->w64[0] = cval[0][0];
  c->w64[1] = cval[0][1];
  c->w64[2] = cval[1][0];
  c->w64[3] = cval[1][1];
  c[1].w64[0] = cval[2][0];
  c[1].w64[1] = cval[2][1];
  c[1].w64[2] = cval[3][0];
  c[1].w64[3] = cval[3][1];
  c[2].w64[0] = cval[4][0];
  c[2].w64[1] = cval[4][1];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_128_640(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[5] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 3) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      cval[4] = mm128_xor_mask(cval[4], mm128_load(Ablock[2].w64), mask);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
}